

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall
btConvexHullInternal::Rational128::Rational128
          (Rational128 *this,Int128 *numerator,Int128 *denominator)

{
  int iVar1;
  Int128 *in_RDX;
  Int128 *in_RSI;
  Int128 *in_RDI;
  Int128 IVar2;
  int dsign;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_28;
  uint64_t local_20;
  
  Int128::Int128(in_RDI);
  Int128::Int128(in_RDI + 1);
  iVar1 = Int128::getSign(in_RSI);
  *(int *)&in_RDI[2].low = iVar1;
  if ((int)in_RDI[2].low < 0) {
    IVar2 = Int128::operator-((Int128 *)0x1531ea);
    local_28 = IVar2.low;
    in_RDI->low = local_28;
    local_20 = IVar2.high;
    in_RDI->high = local_20;
  }
  else {
    in_RDI->low = in_RSI->low;
    in_RDI->high = in_RSI->high;
  }
  iVar1 = Int128::getSign(in_RDX);
  if (iVar1 < 0) {
    *(int *)&in_RDI[2].low = -(int)in_RDI[2].low;
    IVar2 = Int128::operator-((Int128 *)0x153251);
    local_40 = IVar2.low;
    in_RDI[1].low = local_40;
    local_38 = IVar2.high;
    in_RDI[1].high = local_38;
  }
  else {
    in_RDI[1].low = in_RDX->low;
    in_RDI[1].high = in_RDX->high;
  }
  *(undefined1 *)((long)&in_RDI[2].low + 4) = 0;
  return;
}

Assistant:

Rational128(const Int128& numerator, const Int128& denominator)
				{
					sign = numerator.getSign();
					if (sign >= 0)
					{
						this->numerator = numerator;
					}
					else
					{
						this->numerator = -numerator;
					}
					int dsign = denominator.getSign();
					if (dsign >= 0)
					{
						this->denominator = denominator;
					}
					else
					{
						sign = -sign;
						this->denominator = -denominator;
					}
					isInt64 = false;
				}